

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

PrimitiveSymbol * slang::ast::PrimitiveSymbol::fromSyntax(Scope *scope,UdpDeclarationSyntax *syntax)

{
  pointer ppUVar1;
  undefined4 uVar2;
  anon_union_8_2_f12d5f64_for_typeOrLink args;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar4;
  UdpBodySyntax *pUVar5;
  UdpInitialStmtSyntax *this;
  UdpEntrySyntax *syntax_00;
  UdpFieldBaseSyntax *pUVar6;
  int *piVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  string_view sVar13;
  string_view sVar14;
  string_view sVar15;
  string_view sVar16;
  string_view sVar17;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_03;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  char cVar20;
  char cVar21;
  char cVar22;
  void *__s;
  span<const_char,_18446744073709551615UL> inputs;
  span<const_char,_18446744073709551615UL> inputs_00;
  undefined1 auVar23 [12];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ValueSymbol *pVVar27;
  basic_string_view<char,_std::char_traits<char>_> *pbVar28;
  value_type *pvVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  pointer ppPVar32;
  bool bVar33;
  logic_t lVar34;
  logic_t lVar35;
  byte bVar37;
  int iVar38;
  bitwidth_t bVar39;
  PrimitivePortSymbol *this_00;
  SyntaxNode *pSVar41;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar42;
  SourceLocation SVar43;
  PrimitivePortSymbol *pPVar44;
  undefined4 extraout_var;
  Diagnostic *pDVar45;
  Expression *this_01;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_02;
  reference pcVar46;
  undefined8 extraout_RAX;
  byte bVar36;
  uint uVar40;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  _Var47;
  size_t __n;
  uint64_t uVar48;
  uint uVar49;
  undefined8 uVar50;
  size_type sVar51;
  pointer ppUVar52;
  value_type *extraout_RDX;
  value_type *extraout_RDX_00;
  value_type *extraout_RDX_01;
  value_type *extraout_RDX_02;
  value_type *extraout_RDX_03;
  value_type *extraout_RDX_04;
  value_type *extraout_RDX_05;
  value_type *extraout_RDX_06;
  value_type *extraout_RDX_07;
  size_t extraout_RDX_08;
  value_type *extraout_RDX_09;
  value_type *extraout_RDX_10;
  value_type *extraout_RDX_11;
  value_type *extraout_RDX_12;
  NodeRef NVar53;
  value_type *extraout_RDX_13;
  value_type *extraout_RDX_14;
  value_type *pvVar54;
  value_type *extraout_RDX_15;
  value_type *extraout_RDX_16;
  value_type *extraout_RDX_17;
  value_type *extraout_RDX_18;
  size_type sVar55;
  EVP_PKEY_CTX *extraout_RDX_19;
  char *extraout_RDX_20;
  char *extraout_RDX_21;
  undefined8 extraout_RDX_22;
  undefined8 extraout_RDX_23;
  ulong extraout_RDX_24;
  EVP_PKEY_CTX *extraout_RDX_25;
  EVP_PKEY_CTX *extraout_RDX_26;
  char *extraout_RDX_27;
  EVP_PKEY_CTX *pEVar57;
  EVP_PKEY_CTX *extraout_RDX_28;
  PrimitivePortSymbol *extraout_RDX_29;
  EVP_PKEY_CTX *extraout_RDX_30;
  EVP_PKEY_CTX *extraout_RDX_31;
  EVP_PKEY_CTX *extraout_RDX_32;
  EVP_PKEY_CTX *extraout_RDX_33;
  unsigned_long extraout_RDX_34;
  value_type *extraout_RDX_35;
  value_type *extraout_RDX_36;
  value_type *extraout_RDX_37;
  byte bVar58;
  UdpOutputPortDeclSyntax *outputDecl;
  Scope *pSVar59;
  SyntaxNode *pSVar60;
  UdpEntrySyntax *pUVar61;
  size_type __n2;
  long lVar62;
  PrimitivePortSymbol *pPVar63;
  size_t sVar64;
  byte *pbVar65;
  byte stateChar;
  DiagCode code;
  ValueDriver *pVVar66;
  PrimitivePortSymbol *pPVar67;
  char cVar68;
  SourceLocation *pSVar69;
  long lVar70;
  long *plVar71;
  ulong uVar72;
  undefined8 uVar73;
  long lVar74;
  difference_type __len;
  DeclaredType *this_03;
  undefined8 uVar75;
  value_type *pvVar76;
  ExpressionSyntax *__n_00;
  size_type __rlen;
  ulong uVar77;
  undefined1 auVar78 [8];
  size_t sVar79;
  bool bVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  SourceRange SVar85;
  string_view sVar86;
  string_view sVar87;
  string_view sVar88;
  string_view sVar89;
  value_type *elements_3;
  value_type *elements;
  PrimitivePortSymbol *local_310;
  UdpInputPortDeclSyntax *inputDecl_1;
  undefined8 local_2d8;
  PrimitivePortSymbol *port_2;
  size_t local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  UdpInputPortDeclSyntax *local_2a0;
  PrimitivePortSymbol *port_1;
  SymbolIndex SStack_290;
  bool bStack_28c;
  bool bStack_28b;
  undefined2 uStack_28a;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288 [3];
  value_type *elements_1;
  value_type *elements_2;
  anon_union_8_2_f12d5f64_for_typeOrLink local_248;
  undefined1 local_240 [8];
  PrimitivePortDirection dir;
  undefined1 auStack_234 [12];
  undefined8 local_228;
  PrimitivePortSymbol *port;
  undefined4 uStack_1f0;
  undefined1 uStack_1ec;
  bool bStack_1eb;
  undefined2 uStack_1ea;
  undefined8 local_1e8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  try_emplace_args_t local_178 [16];
  string_view primName;
  Token name;
  undefined1 local_f0 [56];
  SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> ports;
  PoolAllocator<slang::ast::BitTrie,_72UL,_8UL> trieAlloc;
  BumpAllocator alloc;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  undefined1 auVar12 [15];
  undefined4 extraout_var_00;
  char *pcVar56;
  
  args = (anon_union_8_2_f12d5f64_for_typeOrLink)scope->compilation;
  primName = parsing::Token::valueText(&syntax->name);
  name._0_8_ = parsing::Token::location(&syntax->name);
  auVar24._12_4_ = 0;
  auVar24._0_12_ = stack0xfffffffffffffe0c;
  _port = auVar24 << 0x20;
  this_00 = (PrimitivePortSymbol *)
            BumpAllocator::
            emplace<slang::ast::PrimitiveSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ast::PrimitiveSymbol::PrimitiveKind>
                      ((BumpAllocator *)args.typeSyntax,(Compilation *)args,&primName,
                       (SourceLocation *)&name,(PrimitiveKind *)&port);
  syntax_01._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_01._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes((Symbol *)this_00,scope,syntax_01);
  (this_00->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)syntax;
  pSVar60 = &((syntax->portList).ptr)->super_SyntaxNode;
  pvVar76 = extraout_RDX;
  local_248 = args;
  local_1b0 = syntax;
  if (pSVar60->kind == WildcardUdpPortList) {
    pSVar41 = Compilation::getExternDefinition((Compilation *)args.typeSyntax,primName,scope);
    if ((pSVar41 == (SyntaxNode *)0x0) || (pSVar41->kind != ExternUdpDecl)) {
      SVar85 = slang::syntax::SyntaxNode::sourceRange(pSVar60);
      pDVar45 = Scope::addDiag(scope,(DiagCode)0x7d0006,SVar85);
      Diagnostic::operator<<(pDVar45,primName);
      pvVar76 = extraout_RDX_01;
    }
    else {
      pSVar60 = pSVar41[7].previewNode;
      pvVar76 = extraout_RDX_00;
    }
  }
  ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_ =
       (pointer)ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.firstElement;
  ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len = 0;
  ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.cap = 5;
  if (pSVar60->kind == NonAnsiUdpPortList) {
    pvVar76 = (value_type *)local_f0;
    local_f0._8_8_ = (SourceLocation)0x3f;
    local_f0._16_8_ = (PrimitivePortSymbol *)0x1;
    local_f0._24_16_ = ZEXT816(0x46c9a0);
    local_f0._40_8_ = 0;
    local_f0._48_8_ = 0;
    pbVar65 = (byte *)((long)&(pSVar60[3].previewNode)->kind + 1);
    local_f0._0_8_ = &name;
    if ((byte *)0x1 < pbVar65) {
      auVar78 = (undefined1  [8])((ulong)pbVar65 >> 1);
      pSVar59 = (Scope *)&(this_00->super_ValueSymbol).declaredType;
      pPVar44 = (PrimitivePortSymbol *)0x0;
      elements_2 = (value_type *)pSVar59;
      local_240 = auVar78;
      do {
        ppSVar42 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                             ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                              (pSVar60[3].parent + (long)pPVar44 * 2));
        uVar73 = *(undefined8 *)(*ppSVar42 + 1);
        pSVar41 = (*ppSVar42)[1].parent;
        port_1._0_6_ = (undefined6)uVar73;
        port_1._6_2_ = (undefined2)((ulong)uVar73 >> 0x30);
        SStack_290 = (SymbolIndex)pSVar41;
        bStack_28c = SUB81((ulong)pSVar41 >> 0x20,0);
        bStack_28b = SUB81((ulong)pSVar41 >> 0x28,0);
        uStack_28a = (undefined2)((ulong)pSVar41 >> 0x30);
        _port = (undefined1  [16])parsing::Token::valueText((Token *)&port_1);
        SVar43 = parsing::Token::location((Token *)&port_1);
        _dir = SVar43;
        local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
        port_2 = BumpAllocator::
                 emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection>
                           ((BumpAllocator *)local_248.typeSyntax,(Compilation *)local_248,
                            (basic_string_view<char,_std::char_traits<char>_> *)&port,
                            (SourceLocation *)&dir,(PrimitivePortDirection *)local_178);
        SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
        emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                  ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)&ports,&port_2);
        Scope::insertMember(pSVar59,(Symbol *)port_2,
                            (Symbol *)(this_00->super_ValueSymbol).declaredType.initializer,false,
                            true);
        sVar86 = parsing::Token::valueText((Token *)&port_1);
        pvVar76 = (value_type *)sVar86._M_str;
        if (sVar86._M_len != 0) {
          _dir = (undefined1  [16])parsing::Token::valueText((Token *)&port_1);
          uVar48 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              local_f0,(basic_string_view<char,_std::char_traits<char>_> *)&dir);
          pVVar66 = (ValueDriver *)(uVar48 >> (local_f0[8] & 0x3f));
          uVar31 = local_f0._24_8_;
          pvVar76 = (value_type *)(uVar48 & 0xff);
          lVar70 = (long)pvVar76 * 4;
          cVar68 = (&UNK_0046cabc)[lVar70];
          cVar20 = (&UNK_0046cabd)[lVar70];
          cVar21 = (&UNK_0046cabe)[lVar70];
          cVar22 = (&UNK_0046cabf)[lVar70];
          uVar75 = local_f0._32_8_;
          uVar73 = _dir;
          uVar30 = auStack_234._4_8_;
          uVar50._0_4_ = (uint)uVar48 & 7;
          uVar50._4_4_ = 0;
          local_188 = local_f0._16_8_;
          local_198 = (PrimitivePortSymbol *)0x0;
          elements_1 = (value_type *)pVVar66;
          do {
            pcVar56 = (char *)(uVar31 + (long)pVVar66 * 0x10);
            auVar81[0] = -(*pcVar56 == cVar68);
            auVar81[1] = -(pcVar56[1] == cVar20);
            auVar81[2] = -(pcVar56[2] == cVar21);
            auVar81[3] = -(pcVar56[3] == cVar22);
            auVar81[4] = -(pcVar56[4] == cVar68);
            auVar81[5] = -(pcVar56[5] == cVar20);
            auVar81[6] = -(pcVar56[6] == cVar21);
            auVar81[7] = -(pcVar56[7] == cVar22);
            auVar81[8] = -(pcVar56[8] == cVar68);
            auVar81[9] = -(pcVar56[9] == cVar20);
            auVar81[10] = -(pcVar56[10] == cVar21);
            auVar81[0xb] = -(pcVar56[0xb] == cVar22);
            auVar81[0xc] = -(pcVar56[0xc] == cVar68);
            auVar81[0xd] = -(pcVar56[0xd] == cVar20);
            auVar81[0xe] = -(pcVar56[0xe] == cVar21);
            auVar81[0xf] = -(pcVar56[0xf] == cVar22);
            uVar40 = (uint)(ushort)((ushort)(SUB161(auVar81 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar81 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar81 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar81 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar81 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar81 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar81 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar81 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar81 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar81 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar81 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar81 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar81 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar81 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar81 >> 0x77,0) & 1) << 0xe);
            local_180 = pVVar66;
            if (uVar40 != 0) {
              local_190 = uVar50;
              do {
                uVar49 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                  }
                }
                pSVar69 = (SourceLocation *)(uVar75 + (long)pVVar66 * 0x168 + (ulong)uVar49 * 0x18);
                bVar33 = (SourceLocation)uVar73 == *pSVar69;
                pvVar76 = (value_type *)
                          CONCAT71((int7)((ulong)pvVar76 >> 8),
                                   !bVar33 || (SourceLocation)uVar73 == (SourceLocation)0x0);
                if (bVar33 && (SourceLocation)uVar73 != (SourceLocation)0x0) {
                  iVar38 = bcmp((void *)uVar30,(void *)pSVar69[1],uVar73);
                  bVar33 = iVar38 == 0;
                  pvVar76 = extraout_RDX_09;
                }
                auVar78 = local_240;
                if (bVar33) goto LAB_003d7843;
                uVar40 = uVar40 - 1 & uVar40;
                uVar50 = local_190;
              } while (uVar40 != 0);
            }
            pvVar76 = (value_type *)((long)pVVar66 * 0x10 + uVar31);
            if ((*(byte *)((long)&(pvVar76->first)._M_str + 7) &
                (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[uVar50]) == 0) break;
            lVar70 = local_180 + local_198;
            local_198 = local_198 + 1;
            pVVar66 = (ValueDriver *)(lVar70 + 1U & local_188);
          } while ((ulong)local_198 <= (ulong)local_188);
          pSVar69 = (SourceLocation *)0x0;
LAB_003d7843:
          pSVar59 = (Scope *)elements_2;
          if (pSVar69 == (SourceLocation *)0x0) {
            if ((ulong)local_f0._48_8_ < (ulong)local_f0._40_8_) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
              ::
              nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*&>
                        ((locator *)&port,
                         (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
                          *)local_f0,(arrays_type *)(local_f0 + 8),(size_t)elements_1,uVar48,
                         local_178,(basic_string_view<char,_std::char_traits<char>_> *)&dir,&port_2)
              ;
              local_f0._48_8_ = local_f0._48_8_ + 1;
              pvVar76 = extraout_RDX_10;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*&>
                        ((locator *)&port,
                         (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
                          *)local_f0,uVar48,local_178,
                         (basic_string_view<char,_std::char_traits<char>_> *)&dir,&port_2);
              pvVar76 = extraout_RDX_11;
            }
          }
        }
        pPVar44 = (PrimitivePortSymbol *)((long)&(pPVar44->super_ValueSymbol).super_Symbol.kind + 1)
        ;
      } while ((undefined1  [8])pPVar44 != auVar78);
    }
    local_190 = ((not_null<slang::syntax::UdpBodySyntax_*> *)(local_1b0 + 0x78))->ptr;
    uVar77 = ((__extent_storage<18446744073709551615UL> *)(local_190 + 0x48))->_M_extent_value + 1;
    if (uVar77 < 2) {
      local_2a0 = (UdpInputPortDeclSyntax *)0x0;
    }
    else {
      uVar73 = uVar77 >> 1;
      local_2a0 = (UdpInputPortDeclSyntax *)0x0;
      uVar77 = 0;
      local_1a0 = uVar73;
      do {
        ppSVar42 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                             ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                              (((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)
                               (local_190 + 0x40))->_M_ptr + uVar77 * 2));
        inputDecl_1 = (UdpInputPortDeclSyntax *)*ppSVar42;
        if ((inputDecl_1->super_UdpPortDeclSyntax).super_SyntaxNode.kind == UdpOutputPortDecl) {
          pSVar60 = (inputDecl_1->names).super_SyntaxListBase.super_SyntaxNode.parent;
          pSVar41 = (inputDecl_1->names).super_SyntaxListBase.super_SyntaxNode.previewNode;
          port_1._0_6_ = SUB86(pSVar60,0);
          port_1._6_2_ = (undefined2)((ulong)pSVar60 >> 0x30);
          SStack_290 = (SymbolIndex)pSVar41;
          bStack_28c = SUB81((ulong)pSVar41 >> 0x20,0);
          bStack_28b = SUB81((ulong)pSVar41 >> 0x28,0);
          uStack_28a = (undefined2)((ulong)pSVar41 >> 0x30);
          _port = (undefined1  [16])parsing::Token::valueText((Token *)&port_1);
          uVar48 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              local_f0,(basic_string_view<char,_std::char_traits<char>_> *)&port);
          pvVar54 = (value_type *)(uVar48 >> (local_f0[8] & 0x3f));
          uVar31 = local_f0._24_8_;
          lVar70 = (uVar48 & 0xff) * 4;
          cVar68 = (&UNK_0046cabc)[lVar70];
          cVar20 = (&UNK_0046cabd)[lVar70];
          cVar21 = (&UNK_0046cabe)[lVar70];
          cVar22 = (&UNK_0046cabf)[lVar70];
          elements_2 = (value_type *)local_f0._32_8_;
          pPVar44 = port;
          uVar30 = _uStack_1f0;
          local_240 = (undefined1  [8])local_f0._16_8_;
          local_310 = (PrimitivePortSymbol *)0x0;
          do {
            pvVar29 = elements_2;
            pcVar56 = (char *)(uVar31 + (long)pvVar54 * 0x10);
            auVar83[0] = -(*pcVar56 == cVar68);
            auVar83[1] = -(pcVar56[1] == cVar20);
            auVar83[2] = -(pcVar56[2] == cVar21);
            auVar83[3] = -(pcVar56[3] == cVar22);
            auVar83[4] = -(pcVar56[4] == cVar68);
            auVar83[5] = -(pcVar56[5] == cVar20);
            auVar83[6] = -(pcVar56[6] == cVar21);
            auVar83[7] = -(pcVar56[7] == cVar22);
            auVar83[8] = -(pcVar56[8] == cVar68);
            auVar83[9] = -(pcVar56[9] == cVar20);
            auVar83[10] = -(pcVar56[10] == cVar21);
            auVar83[0xb] = -(pcVar56[0xb] == cVar22);
            auVar83[0xc] = -(pcVar56[0xc] == cVar68);
            auVar83[0xd] = -(pcVar56[0xd] == cVar20);
            auVar83[0xe] = -(pcVar56[0xe] == cVar21);
            auVar83[0xf] = -(pcVar56[0xf] == cVar22);
            pvVar76 = pvVar54;
            elements_1 = pvVar54;
            for (uVar40 = (uint)(ushort)((ushort)(SUB161(auVar83 >> 7,0) & 1) |
                                         (ushort)(SUB161(auVar83 >> 0xf,0) & 1) << 1 |
                                         (ushort)(SUB161(auVar83 >> 0x17,0) & 1) << 2 |
                                         (ushort)(SUB161(auVar83 >> 0x1f,0) & 1) << 3 |
                                         (ushort)(SUB161(auVar83 >> 0x27,0) & 1) << 4 |
                                         (ushort)(SUB161(auVar83 >> 0x2f,0) & 1) << 5 |
                                         (ushort)(SUB161(auVar83 >> 0x37,0) & 1) << 6 |
                                         (ushort)(SUB161(auVar83 >> 0x3f,0) & 1) << 7 |
                                         (ushort)(SUB161(auVar83 >> 0x47,0) & 1) << 8 |
                                         (ushort)(SUB161(auVar83 >> 0x4f,0) & 1) << 9 |
                                         (ushort)(SUB161(auVar83 >> 0x57,0) & 1) << 10 |
                                         (ushort)(SUB161(auVar83 >> 0x5f,0) & 1) << 0xb |
                                         (ushort)(SUB161(auVar83 >> 0x67,0) & 1) << 0xc |
                                         (ushort)(SUB161(auVar83 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar83 >> 0x77,0) & 1) << 0xe); uVar40 != 0
                ; uVar40 = uVar40 - 1 & uVar40) {
              uVar49 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                }
              }
              uVar75 = pvVar29 + (long)pvVar54 * 0xf + (ulong)uVar49;
              bVar33 = pPVar44 == (PrimitivePortSymbol *)(((value_type *)uVar75)->first)._M_len;
              pvVar76 = (value_type *)
                        CONCAT71((int7)((ulong)pvVar76 >> 8),
                                 !bVar33 || pPVar44 == (PrimitivePortSymbol *)0x0);
              if (bVar33 && pPVar44 != (PrimitivePortSymbol *)0x0) {
                iVar38 = bcmp((void *)uVar30,(((value_type *)uVar75)->first)._M_str,(size_t)pPVar44)
                ;
                bVar33 = iVar38 == 0;
                pvVar76 = extraout_RDX_15;
              }
              uVar73 = local_1a0;
              if (bVar33) goto LAB_003d7e45;
            }
            if ((*(byte *)((long)pvVar54 * 0x10 + uVar31 + 0xf) &
                (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[(uint)uVar48 & 7]) == 0) break;
            pVVar27 = &local_310->super_ValueSymbol;
            local_310 = (PrimitivePortSymbol *)
                        ((long)&(local_310->super_ValueSymbol).super_Symbol.kind + 1);
            pvVar54 = (value_type *)
                      ((ulong)((long)&((basic_string_view<char,_std::char_traits<char>_> *)
                                      ((long)elements_1 + 1))->_M_len + (long)&pVVar27->super_Symbol
                              ) & (ulong)local_240);
            pvVar76 = pvVar54;
          } while (local_310 <= (ulong)local_240);
          local_1a8 = (value_type *)0x0;
          uVar75 = local_1a8;
LAB_003d7e45:
          local_1a8 = uVar75;
          if ((value_type *)local_1a8 == (value_type *)0x0) {
            sVar86 = parsing::Token::valueText((Token *)&port_1);
            pvVar76 = (value_type *)sVar86._M_str;
            if (sVar86._M_len == 0) {
              inputDecl_1 = local_2a0;
            }
            else {
              SVar85 = parsing::Token::range((Token *)&port_1);
              pDVar45 = Scope::addDiag(scope,(DiagCode)0xab0006,SVar85);
              sVar86 = parsing::Token::valueText((Token *)&port_1);
              Diagnostic::operator<<(pDVar45,sVar86);
              inputDecl_1 = local_2a0;
              pvVar76 = extraout_RDX_17;
            }
          }
          else if ((*(long *)&(inputDecl_1->names).super_SyntaxListBase.super_SyntaxNode == 0) ||
                  ((inputDecl_1->keyword).info != (Info *)0x0)) {
            pPVar44 = *(PrimitivePortSymbol **)(local_1a8 + 0x10);
            port._6_2_ = port_1._6_2_;
            port._0_6_ = port_1._0_6_;
            uStack_1ec = bStack_28c;
            uStack_1f0 = SStack_290;
            bStack_1eb = bStack_28b;
            uStack_1ea = uStack_28a;
            if ((pPVar44->super_ValueSymbol).super_Symbol.originatingSyntax != (SyntaxNode *)0x0) {
              SVar85 = parsing::Token::range((Token *)&port);
              pDVar45 = Scope::addDiag(scope,(DiagCode)0xa90006,SVar85);
              sVar86 = parsing::Token::valueText((Token *)&port);
              Diagnostic::operator<<(pDVar45,sVar86);
              Diagnostic::addNote(pDVar45,(DiagCode)0xa0001,
                                  (pPVar44->super_ValueSymbol).super_Symbol.location);
            }
            pPVar44->direction = Out;
            pPVar44->direction =
                 OutReg - (*(long *)&(inputDecl_1->names).super_SyntaxListBase.super_SyntaxNode == 0
                          );
            SVar43 = parsing::Token::location((Token *)&port_1);
            (pPVar44->super_ValueSymbol).super_Symbol.location = SVar43;
            (pPVar44->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)inputDecl_1;
            syntax_03._M_ptr =
                 (inputDecl_1->super_UdpPortDeclSyntax).attributes.
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr
            ;
            syntax_03._M_extent._M_extent_value =
                 (inputDecl_1->super_UdpPortDeclSyntax).attributes.
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                 _M_extent._M_extent_value;
            Symbol::setAttributes((Symbol *)pPVar44,scope,syntax_03);
            inputDecl_1 = local_2a0;
            pvVar76 = extraout_RDX_16;
          }
          else if (local_2a0 != (UdpInputPortDeclSyntax *)0x0) {
            SVar85 = parsing::Token::range((Token *)&inputDecl_1->names);
            pDVar45 = Scope::addDiag(scope,(DiagCode)0xac0006,SVar85);
            SVar43 = parsing::Token::location((Token *)&local_2a0->names);
            Diagnostic::addNote(pDVar45,(DiagCode)0xa0001,SVar43);
            pvVar76 = extraout_RDX_18;
          }
          local_2a0 = inputDecl_1;
        }
        else {
          uVar72 = (inputDecl_1->names).elements._M_extent._M_extent_value + 1;
          pvVar76 = extraout_RDX_12;
          if (1 < uVar72) {
            local_198 = uVar72 >> 1;
            pPVar44 = (PrimitivePortSymbol *)0x0;
            do {
              ppSVar42 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                   ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     *)((inputDecl_1->names).elements._M_ptr + (long)pPVar44 * 2));
              local_240 = (undefined1  [8])*ppSVar42;
              SVar43 = (((PrimitivePortSymbol *)local_240)->super_ValueSymbol).super_Symbol.location
              ;
              pSVar59 = (((PrimitivePortSymbol *)local_240)->super_ValueSymbol).super_Symbol.
                        parentScope;
              port_1._0_6_ = SVar43._0_6_;
              port_1._6_2_ = SVar43._6_2_;
              SStack_290 = (SymbolIndex)pSVar59;
              bStack_28c = SUB81((ulong)pSVar59 >> 0x20,0);
              bStack_28b = SUB81((ulong)pSVar59 >> 0x28,0);
              uStack_28a = (undefined2)((ulong)pSVar59 >> 0x30);
              _port = (undefined1  [16])parsing::Token::valueText((Token *)&port_1);
              uVar48 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                   *)local_f0,
                                  (basic_string_view<char,_std::char_traits<char>_> *)&port);
              NVar53.pip.value =
                   (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)(uVar48 >> (local_f0[8] & 0x3f));
              uVar31 = local_f0._24_8_;
              lVar70 = (uVar48 & 0xff) * 4;
              cVar68 = (&UNK_0046cabc)[lVar70];
              cVar20 = (&UNK_0046cabd)[lVar70];
              cVar21 = (&UNK_0046cabe)[lVar70];
              cVar22 = (&UNK_0046cabf)[lVar70];
              elements_1 = (value_type *)local_f0._32_8_;
              pPVar67 = port;
              uVar30 = _uStack_1f0;
              local_188 = local_f0._16_8_;
              pPVar63 = (PrimitivePortSymbol *)0x0;
              do {
                pvVar76 = elements_1;
                elements_2 = (value_type *)((long)NVar53.pip.value * 0x10);
                pcVar56 = (char *)((long)&(elements_2->first)._M_len + uVar31);
                auVar82[0] = -(*pcVar56 == cVar68);
                auVar82[1] = -(pcVar56[1] == cVar20);
                auVar82[2] = -(pcVar56[2] == cVar21);
                auVar82[3] = -(pcVar56[3] == cVar22);
                auVar82[4] = -(pcVar56[4] == cVar68);
                auVar82[5] = -(pcVar56[5] == cVar20);
                auVar82[6] = -(pcVar56[6] == cVar21);
                auVar82[7] = -(pcVar56[7] == cVar22);
                auVar82[8] = -(pcVar56[8] == cVar68);
                auVar82[9] = -(pcVar56[9] == cVar20);
                auVar82[10] = -(pcVar56[10] == cVar21);
                auVar82[0xb] = -(pcVar56[0xb] == cVar22);
                auVar82[0xc] = -(pcVar56[0xc] == cVar68);
                auVar82[0xd] = -(pcVar56[0xd] == cVar20);
                auVar82[0xe] = -(pcVar56[0xe] == cVar21);
                auVar82[0xf] = -(pcVar56[0xf] == cVar22);
                local_180 = NVar53.pip.value;
                for (uVar40 = (uint)(ushort)((ushort)(SUB161(auVar82 >> 7,0) & 1) |
                                             (ushort)(SUB161(auVar82 >> 0xf,0) & 1) << 1 |
                                             (ushort)(SUB161(auVar82 >> 0x17,0) & 1) << 2 |
                                             (ushort)(SUB161(auVar82 >> 0x1f,0) & 1) << 3 |
                                             (ushort)(SUB161(auVar82 >> 0x27,0) & 1) << 4 |
                                             (ushort)(SUB161(auVar82 >> 0x2f,0) & 1) << 5 |
                                             (ushort)(SUB161(auVar82 >> 0x37,0) & 1) << 6 |
                                             (ushort)(SUB161(auVar82 >> 0x3f,0) & 1) << 7 |
                                             (ushort)(SUB161(auVar82 >> 0x47,0) & 1) << 8 |
                                             (ushort)(SUB161(auVar82 >> 0x4f,0) & 1) << 9 |
                                             (ushort)(SUB161(auVar82 >> 0x57,0) & 1) << 10 |
                                             (ushort)(SUB161(auVar82 >> 0x5f,0) & 1) << 0xb |
                                             (ushort)(SUB161(auVar82 >> 0x67,0) & 1) << 0xc |
                                             (ushort)(SUB161(auVar82 >> 0x6f,0) & 1) << 0xd |
                                            (ushort)(SUB161(auVar82 >> 0x77,0) & 1) << 0xe);
                    uVar40 != 0; uVar40 = uVar40 - 1 & uVar40) {
                  uVar49 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                    }
                  }
                  local_2d8 = pvVar76 + (long)NVar53.pip.value * 0xf + (ulong)uVar49;
                  bVar33 = pPVar67 == (PrimitivePortSymbol *)(local_2d8->first)._M_len;
                  if (bVar33 && pPVar67 != (PrimitivePortSymbol *)0x0) {
                    iVar38 = bcmp((void *)uVar30,(local_2d8->first)._M_str,(size_t)pPVar67);
                    bVar33 = iVar38 == 0;
                  }
                  uVar73 = local_1a0;
                  if (bVar33) goto LAB_003d7b50;
                }
                if ((*(byte *)((long)&((basic_string_view<char,_std::char_traits<char>_> *)
                                      ((long)elements_2 + 0xf))->_M_len + uVar31) &
                    (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      is_not_overflowed(unsigned_long)::shift)[(uint)uVar48 & 7]) == 0) break;
                pVVar27 = &pPVar63->super_ValueSymbol;
                pPVar63 = (PrimitivePortSymbol *)
                          ((long)&(pPVar63->super_ValueSymbol).super_Symbol.kind + 1);
                NVar53.pip.value =
                     (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)
                     ((ulong)((undefined1 *)(local_180 + 1) + (long)&pVVar27->super_Symbol) &
                     local_188);
              } while (pPVar63 <= (ulong)local_188);
              local_2d8 = (value_type *)0x0;
LAB_003d7b50:
              if (local_2d8 == (value_type *)0x0) {
                sVar86 = parsing::Token::valueText((Token *)&port_1);
                pvVar76 = (value_type *)sVar86._M_str;
                if (sVar86._M_len != 0) {
                  SVar85 = parsing::Token::range((Token *)&port_1);
                  pDVar45 = Scope::addDiag(scope,(DiagCode)0xab0006,SVar85);
                  sVar86 = parsing::Token::valueText((Token *)&port_1);
                  Diagnostic::operator<<(pDVar45,sVar86);
                  pvVar76 = extraout_RDX_14;
                }
              }
              else {
                pPVar67 = local_2d8->second;
                port._6_2_ = port_1._6_2_;
                port._0_6_ = port_1._0_6_;
                uStack_1ec = bStack_28c;
                uStack_1f0 = SStack_290;
                bStack_1eb = bStack_28b;
                uStack_1ea = uStack_28a;
                if ((pPVar67->super_ValueSymbol).super_Symbol.originatingSyntax != (SyntaxNode *)0x0
                   ) {
                  SVar85 = parsing::Token::range((Token *)&port);
                  pDVar45 = Scope::addDiag(scope,(DiagCode)0xa90006,SVar85);
                  sVar86 = parsing::Token::valueText((Token *)&port);
                  Diagnostic::operator<<(pDVar45,sVar86);
                  Diagnostic::addNote(pDVar45,(DiagCode)0xa0001,
                                      (pPVar67->super_ValueSymbol).super_Symbol.location);
                }
                SVar43 = parsing::Token::location((Token *)&port_1);
                (pPVar67->super_ValueSymbol).super_Symbol.location = SVar43;
                (pPVar67->super_ValueSymbol).super_Symbol.originatingSyntax =
                     (SyntaxNode *)local_240;
                syntax_02._M_ptr =
                     (inputDecl_1->super_UdpPortDeclSyntax).attributes.
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     _M_ptr;
                syntax_02._M_extent._M_extent_value =
                     (inputDecl_1->super_UdpPortDeclSyntax).attributes.
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     _M_extent._M_extent_value;
                Symbol::setAttributes((Symbol *)pPVar67,scope,syntax_02);
                pvVar76 = extraout_RDX_13;
              }
              pPVar44 = (PrimitivePortSymbol *)
                        ((long)&(pPVar44->super_ValueSymbol).super_Symbol.kind + 1);
            } while (pPVar44 != (PrimitivePortSymbol *)local_198);
          }
        }
        uVar77 = uVar77 + 1;
      } while (uVar77 != uVar73);
    }
    if (local_2a0 != (UdpInputPortDeclSyntax *)0x0) {
      pSVar60 = (local_2a0->names).super_SyntaxListBase.super_SyntaxNode.parent;
      pSVar41 = (local_2a0->names).super_SyntaxListBase.super_SyntaxNode.previewNode;
      port_1._0_6_ = SUB86(pSVar60,0);
      port_1._6_2_ = (undefined2)((ulong)pSVar60 >> 0x30);
      SStack_290 = (SymbolIndex)pSVar41;
      bStack_28c = SUB81((ulong)pSVar41 >> 0x20,0);
      bStack_28b = SUB81((ulong)pSVar41 >> 0x28,0);
      uStack_28a = (undefined2)((ulong)pSVar41 >> 0x30);
      _port = (undefined1  [16])parsing::Token::valueText((Token *)&port_1);
      uVar48 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          local_f0,(basic_string_view<char,_std::char_traits<char>_> *)&port);
      uVar30 = local_f0._16_8_;
      uVar77 = uVar48 >> (local_f0[8] & 0x3f);
      uVar31 = local_f0._24_8_;
      uVar2 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar48 & 0xff];
      uVar75 = local_f0._32_8_;
      pPVar44 = port;
      uVar73 = _uStack_1f0;
      pvVar54 = (value_type *)0x0;
      do {
        pcVar56 = (char *)(uVar31 + uVar77 * 0x10);
        local_2d8._0_1_ = (char)uVar2;
        local_2d8._1_1_ = (char)((uint)uVar2 >> 8);
        local_2d8._2_1_ = (char)((uint)uVar2 >> 0x10);
        local_2d8._3_1_ = (char)((uint)uVar2 >> 0x18);
        auVar84[0] = -(*pcVar56 == (char)local_2d8);
        auVar84[1] = -(pcVar56[1] == local_2d8._1_1_);
        auVar84[2] = -(pcVar56[2] == local_2d8._2_1_);
        auVar84[3] = -(pcVar56[3] == local_2d8._3_1_);
        auVar84[4] = -(pcVar56[4] == (char)local_2d8);
        auVar84[5] = -(pcVar56[5] == local_2d8._1_1_);
        auVar84[6] = -(pcVar56[6] == local_2d8._2_1_);
        auVar84[7] = -(pcVar56[7] == local_2d8._3_1_);
        auVar84[8] = -(pcVar56[8] == (char)local_2d8);
        auVar84[9] = -(pcVar56[9] == local_2d8._1_1_);
        auVar84[10] = -(pcVar56[10] == local_2d8._2_1_);
        auVar84[0xb] = -(pcVar56[0xb] == local_2d8._3_1_);
        auVar84[0xc] = -(pcVar56[0xc] == (char)local_2d8);
        auVar84[0xd] = -(pcVar56[0xd] == local_2d8._1_1_);
        auVar84[0xe] = -(pcVar56[0xe] == local_2d8._2_1_);
        auVar84[0xf] = -(pcVar56[0xf] == local_2d8._3_1_);
        uVar40 = (uint)(ushort)((ushort)(SUB161(auVar84 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar84 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar84 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar84 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar84 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar84 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar84 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar84 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar84 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar84 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar84 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar84 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar84 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar84 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar84 >> 0x77,0) & 1) << 0xe);
        if (uVar40 != 0) {
          pvVar76 = pvVar54;
          do {
            uVar49 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
              }
            }
            plVar71 = (long *)(uVar75 + uVar77 * 0x168 + (ulong)uVar49 * 0x18);
            bVar33 = pPVar44 == (PrimitivePortSymbol *)*plVar71;
            pvVar76 = (value_type *)
                      CONCAT71((int7)((ulong)pvVar76 >> 8),
                               !bVar33 || pPVar44 == (PrimitivePortSymbol *)0x0);
            if (bVar33 && pPVar44 != (PrimitivePortSymbol *)0x0) {
              iVar38 = bcmp((void *)uVar73,(void *)plVar71[1],(size_t)pPVar44);
              bVar33 = iVar38 == 0;
              pvVar76 = extraout_RDX_35;
            }
            if (bVar33) {
              lVar70 = plVar71[2];
              if (*(long *)(lVar70 + 0x38) != 0) {
                if (*(int *)(lVar70 + 0x150) == 0) {
                  SVar85 = parsing::Token::range((Token *)&port_1);
                  pDVar45 = Scope::addDiag(scope,(DiagCode)0xad0006,SVar85);
                  Diagnostic::operator<<(pDVar45,*(string_view *)(lVar70 + 8));
                  pvVar76 = extraout_RDX_37;
                }
                else if (*(int *)(lVar70 + 0x150) == 2) {
                  port._6_2_ = port_1._6_2_;
                  port._0_6_ = port_1._0_6_;
                  uStack_1ec = bStack_28c;
                  uStack_1f0 = SStack_290;
                  bStack_1eb = bStack_28b;
                  uStack_1ea = uStack_28a;
                  SVar85 = parsing::Token::range((Token *)&port);
                  pDVar45 = Scope::addDiag(scope,(DiagCode)0xa90006,SVar85);
                  sVar86 = parsing::Token::valueText((Token *)&port);
                  Diagnostic::operator<<(pDVar45,sVar86);
                  Diagnostic::addNote(pDVar45,(DiagCode)0xa0001,*(SourceLocation *)(lVar70 + 0x18));
                  pvVar76 = extraout_RDX_36;
                }
                else {
                  *(undefined4 *)(lVar70 + 0x150) = 2;
                }
              }
              goto LAB_003d7437;
            }
            uVar40 = uVar40 - 1 & uVar40;
          } while (uVar40 != 0);
        }
        pbVar28 = &pvVar54->first;
        pvVar54 = (value_type *)((long)&(pvVar54->first)._M_len + 1);
        uVar77 = (ulong)((long)&pbVar28->_M_len + uVar77 + 1) & uVar30;
      } while( true );
    }
LAB_003d7437:
    ppPVar32 = ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_;
    if (ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len != 0) {
      lVar70 = ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len << 3;
      lVar74 = 0;
      do {
        lVar62 = *(long *)((long)ppPVar32 + lVar74);
        if ((*(long *)(lVar62 + 0x38) == 0) && (*(long *)(lVar62 + 8) != 0)) {
          pDVar45 = Scope::addDiag(scope,(DiagCode)0xaa0006,*(SourceLocation *)(lVar62 + 0x18));
          Diagnostic::operator<<(pDVar45,*(string_view *)(lVar62 + 8));
          pvVar76 = extraout_RDX_06;
        }
        lVar74 = lVar74 + 8;
      } while (lVar70 != lVar74);
    }
    port = (PrimitivePortSymbol *)local_f0._0_8_;
    if ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>
         *)local_f0._32_8_ !=
        (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>
         *)0x0) {
      slang::detail::hashing::
      StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>
      ::deallocate((StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>
                    *)&port,(pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>
                             *)local_f0._32_8_,(local_f0._16_8_ * 0x178 + 0x186U) / 0x18);
      pvVar76 = extraout_RDX_07;
    }
  }
  else {
    if (pSVar60->kind != AnsiUdpPortList) goto LAB_003d9053;
    pbVar65 = (byte *)((long)&(pSVar60[3].previewNode)->kind + 1);
    if ((byte *)0x1 < pbVar65) {
      this_03 = &(this_00->super_ValueSymbol).declaredType;
      uVar77 = 0;
      do {
        ppSVar42 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                             ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                              (pSVar60[3].parent + uVar77 * 2));
        pSVar3 = *ppSVar42;
        if (pSVar3->kind == UdpOutputPortDecl) {
          dir = 2 - (uint)(pSVar3[4].parent == (SyntaxNode *)0x0);
          name = (Token)parsing::Token::valueText((Token *)&pSVar3[4].previewNode);
          SVar43 = parsing::Token::location((Token *)&pSVar3[4].previewNode);
          port_1._0_6_ = SVar43._0_6_;
          port_1._6_2_ = SVar43._6_2_;
          pPVar44 = BumpAllocator::
                    emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection&>
                              ((BumpAllocator *)local_248.typeSyntax,(Compilation *)local_248,
                               (basic_string_view<char,_std::char_traits<char>_> *)&name,
                               (SourceLocation *)&port_1,&dir);
          port = pPVar44;
          (pPVar44->super_ValueSymbol).super_Symbol.originatingSyntax = pSVar3;
          Symbol::setAttributes
                    ((Symbol *)pPVar44,scope,
                     *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                       *)&pSVar3[2].previewNode);
          SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
          emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                    ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)&ports,&port);
          Scope::insertMember((Scope *)this_03,(Symbol *)port,
                              (Symbol *)(this_00->super_ValueSymbol).declaredType.initializer,false,
                              true);
          pvVar76 = extraout_RDX_03;
        }
        else {
          pvVar76 = extraout_RDX_02;
          if (1 < *(long *)(pSVar3 + 6) + 1U) {
            uVar72 = *(long *)(pSVar3 + 6) + 1U >> 1;
            lVar70 = 0;
            do {
              ppSVar42 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                   ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     *)((long)&(pSVar3[5].previewNode)->kind + lVar70));
              pSVar4 = *ppSVar42;
              name = *(Token *)(pSVar4 + 1);
              _port = (undefined1  [16])parsing::Token::valueText(&name);
              SVar43 = parsing::Token::location(&name);
              _dir = SVar43;
              port_2 = (PrimitivePortSymbol *)((ulong)port_2 & 0xffffffff00000000);
              pPVar44 = BumpAllocator::
                        emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection>
                                  ((BumpAllocator *)local_248.typeSyntax,(Compilation *)local_248,
                                   (basic_string_view<char,_std::char_traits<char>_> *)&port,
                                   (SourceLocation *)&dir,(PrimitivePortDirection *)&port_2);
              port_1._0_6_ = SUB86(pPVar44,0);
              port_1._6_2_ = (undefined2)((ulong)pPVar44 >> 0x30);
              (pPVar44->super_ValueSymbol).super_Symbol.originatingSyntax = pSVar4;
              Symbol::setAttributes
                        ((Symbol *)pPVar44,scope,
                         *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                           *)&pSVar3[2].previewNode);
              SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
              emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                        ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)&ports,&port_1);
              Scope::insertMember((Scope *)this_03,(Symbol *)CONCAT26(port_1._6_2_,port_1._0_6_),
                                  (Symbol *)(this_00->super_ValueSymbol).declaredType.initializer,
                                  false,true);
              lVar70 = lVar70 + 0x30;
              uVar72 = uVar72 - 1;
              pvVar76 = extraout_RDX_04;
            } while (uVar72 != 0);
          }
        }
        uVar77 = uVar77 + 1;
      } while (uVar77 != (ulong)pbVar65 >> 1);
    }
    pUVar5 = ((not_null<slang::syntax::UdpBodySyntax_*> *)(local_1b0 + 0x78))->ptr;
    if ((pUVar5->portDecls).elements._M_extent._M_extent_value != 0) {
      ppSVar42 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            (pUVar5->portDecls).elements._M_ptr);
      SVar85 = slang::syntax::SyntaxNode::sourceRange(*ppSVar42);
      Scope::addDiag(scope,(DiagCode)0xa20006,SVar85);
      pvVar76 = extraout_RDX_05;
    }
  }
  iVar38 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::copy
                     (&ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>,
                      (EVP_PKEY_CTX *)local_248.typeSyntax,(EVP_PKEY_CTX *)pvVar76);
  ((span<const_slang::ast::PrimitivePortSymbol_*const,_18446744073709551615UL> *)
  &(this_00->super_ValueSymbol).declaredType.flags)->_M_ptr = (pointer)CONCAT44(extraout_var,iVar38)
  ;
  (this_00->super_ValueSymbol).driverMap.field_0.rootLeaf.
  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
  .first[0].left = extraout_RDX_08;
  code.subsystem = Declarations;
  code.code = 0xae;
  pPVar44 = this_00;
  if (ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len < 2) {
LAB_003d754a:
    Scope::addDiag(scope,code,(pPVar44->super_ValueSymbol).super_Symbol.location);
    goto LAB_003d9053;
  }
  pPVar44 = *ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_;
  if (pPVar44->direction == OutReg) {
    *(undefined1 *)((long)&(this_00->super_ValueSymbol).driverMap.field_0 + 0x20) = 1;
    pSVar60 = (pPVar44->super_ValueSymbol).super_Symbol.originatingSyntax;
    if (((pSVar60 == (SyntaxNode *)0x0) || (pSVar60->kind != UdpOutputPortDecl)) ||
       (pSVar60[5].parent == (SyntaxNode *)0x0)) goto LAB_003d803a;
    pSVar60 = pSVar60[5].parent[1].previewNode;
  }
  else {
    code.subsystem = Declarations;
    code.code = 0xa7;
    if (pPVar44->direction == In) goto LAB_003d754a;
LAB_003d803a:
    pSVar60 = (SyntaxNode *)0x0;
  }
  sVar55 = 2;
  if (2 < ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len) {
    sVar55 = ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len;
  }
  sVar51 = 1;
  do {
    pPVar44 = ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_[sVar51];
    if (pPVar44->direction != In) {
      pVVar27 = &pPVar44->super_ValueSymbol;
      pPVar44 = (PrimitivePortSymbol *)0xa40006;
      Scope::addDiag(scope,(DiagCode)0xa40006,
                     *(SourceLocation *)&(pVVar27->super_Symbol).location.field_0x0);
      break;
    }
    sVar51 = sVar51 + 1;
  } while (sVar55 != sVar51);
  this = ((not_null<slang::syntax::UdpBodySyntax_*> *)(local_1b0 + 0x78))->ptr->initialStmt;
  if (this != (UdpInitialStmtSyntax *)0x0) {
    if (*(char *)((long)&(this_00->super_ValueSymbol).driverMap.field_0 + 0x20) == '\0') {
      SVar85 = slang::syntax::SyntaxNode::sourceRange(&this->super_SyntaxNode);
      pPVar44 = (PrimitivePortSymbol *)0xa60006;
      Scope::addDiag(scope,(DiagCode)0xa60006,SVar85);
    }
    else if (pSVar60 == (SyntaxNode *)0x0) {
      pSVar60 = &((this->value).ptr)->super_SyntaxNode;
      sVar86 = parsing::Token::valueText(&this->name);
      __n = sVar86._M_len;
      if (__n != 0) {
        sVar8 = ((*ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_)->
                super_ValueSymbol).super_Symbol.name._M_len;
        if (sVar8 != 0) {
          if (__n == sVar8) {
            pPVar44 = (PrimitivePortSymbol *)
                      ((*ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_)
                      ->super_ValueSymbol).super_Symbol.name._M_str;
            iVar38 = bcmp(sVar86._M_str,pPVar44,__n);
            if (iVar38 == 0) goto LAB_003d8113;
          }
          SVar85 = parsing::Token::range(&this->name);
          pDVar45 = Scope::addDiag(scope,(DiagCode)0xaf0006,SVar85);
          Diagnostic::operator<<(pDVar45,sVar86);
          pPVar44 = (PrimitivePortSymbol *)0x50001;
          Diagnostic::addNote(pDVar45,(DiagCode)0x50001,
                              ((*ports.
                                 super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.
                                 data_)->super_ValueSymbol).super_Symbol.location);
        }
      }
    }
    else {
      SVar85 = slang::syntax::SyntaxNode::sourceRange(&this->super_SyntaxNode);
      pDVar45 = Scope::addDiag(scope,(DiagCode)0xa30006,SVar85);
      name = slang::syntax::SyntaxNode::getFirstToken(pSVar60);
      SVar43 = parsing::Token::location(&name);
      pPVar44 = (PrimitivePortSymbol *)0xa0001;
      Diagnostic::addNote(pDVar45,(DiagCode)0xa0001,SVar43);
    }
  }
LAB_003d8113:
  if (pSVar60 != (SyntaxNode *)0x0) {
    pPVar44 = (PrimitivePortSymbol *)&name;
    name.info._0_4_ = 0xffffffff;
    name._0_8_ = scope;
    iVar38 = Expression::bind((int)pSVar60,(sockaddr *)pPVar44,0);
    this_01 = (Expression *)CONCAT44(extraout_var_00,iVar38);
    bVar33 = Expression::bad(this_01);
    if (!bVar33) {
      if ((this_01->kind == IntegerLiteral) &&
         ((bVar39 = Type::getBitWidth((this_01->type).ptr), bVar39 == 1 ||
          (bVar33 = Expression::isUnsizedInteger(this_01), bVar33)))) {
        pPVar44 = (PrimitivePortSymbol *)&name;
        ASTContext::eval((ConstantValue *)&local_58,(ASTContext *)pPVar44,this_01,
                         (bitmask<slang::ast::EvalFlags>)0x0);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_58);
        if (&this_01->constant->value !=
            (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             *)0x0) {
          this_02 = std::
                    get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                              (&this_01->constant->value);
          _port = ZEXT814(0) << 0x30;
          auVar24 = _port;
          auVar23._8_4_ = 0;
          auVar23._0_8_ = _uStack_1f0;
          _port = auVar23 << 0x40;
          _bStack_1eb = auVar24._13_3_;
          uStack_1ec = 1;
          _port = ZEXT412(1) << 0x40;
          SVInt::clearUnusedBits((SVInt *)&port);
          lVar34 = SVInt::operator==(this_02,(SVInt *)&port);
          bStack_28b = false;
          port_1._0_6_ = 1;
          port_1._6_2_ = 0;
          bStack_28c = true;
          SStack_290 = 2;
          SVInt::clearUnusedBits((SVInt *)&port_1);
          pPVar44 = (PrimitivePortSymbol *)&port_1;
          lVar35 = SVInt::operator==(this_02,(SVInt *)pPVar44);
          bVar33 = false;
          cVar68 = -0x80;
          if (lVar35.value == '\0' && lVar34.value == '\0') {
            cVar68 = '\0';
          }
          if (lVar35.value == '\x01') {
            cVar68 = '\x01';
          }
          if (lVar34.value == '\x01') {
            cVar68 = '\x01';
          }
          if ((this_02->super_SVIntStorage).bitWidth == 1) {
            pPVar44 = (PrimitivePortSymbol *)0x0;
            lVar34 = SVInt::operator[](this_02,0);
            bVar33 = lVar34.value == 0x80;
          }
          if (((0x40 < SStack_290) || ((bStack_28b & 1U) != 0)) &&
             ((void *)CONCAT26(port_1._6_2_,port_1._0_6_) != (void *)0x0)) {
            operator_delete__((void *)CONCAT26(port_1._6_2_,port_1._0_6_));
          }
          if (((0x40 < (uint)uStack_1f0) ||
              ((_port & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0)) &&
             (port != (PrimitivePortSymbol *)0x0)) {
            operator_delete__(port);
          }
          if (bVar33 || cVar68 != '\0' && (cVar68 != '@' && cVar68 != -0x80)) {
            (this_00->super_ValueSymbol).driverMap.field_0.rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
            .first[1].right = (unsigned_long)this_01->constant;
          }
        }
      }
      if ((this_00->super_ValueSymbol).driverMap.field_0.rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
          .first[1].right == 0) {
        pPVar44 = (PrimitivePortSymbol *)0xa50006;
        Scope::addDiag(scope,(DiagCode)0xa50006,this_01->sourceRange);
      }
    }
  }
  name.kind = Unknown;
  name._2_1_ = 0;
  name.numFlags.raw = '\0';
  name.rawLen = 0;
  name.info = (Info *)0x0;
  BumpAllocator::BumpAllocator(&alloc);
  trieAlloc.freeList = (FreeNode *)0x0;
  _uStack_1f0 = 0;
  port = (PrimitivePortSymbol *)&stack0xfffffffffffffe20;
  local_1e8 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>
               *)0x2;
  pUVar5 = ((not_null<slang::syntax::UdpBodySyntax_*> *)(local_1b0 + 0x78))->ptr;
  sVar64 = (pUVar5->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>.
           _M_extent._M_extent_value;
  pEVar57 = extraout_RDX_19;
  trieAlloc.alloc = &alloc;
  if (sVar64 != 0) {
    pvVar76 = (value_type *)
              (pUVar5->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>.
              _M_ptr;
    elements_1 = (value_type *)(&(pvVar76->first)._M_len + sVar64);
    do {
      sVar55 = ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len;
      syntax_00 = (UdpEntrySyntax *)(pvVar76->first)._M_len;
      port_1._0_6_ = (undefined6)((long)local_288 + 8);
      port_1._6_2_ = (undefined2)((ulong)((long)local_288 + 8) >> 0x30);
      SStack_290 = 0;
      bStack_28c = false;
      bStack_28b = false;
      uStack_28a = 0;
      local_288[0]._M_allocated_capacity = (SyntaxNode *)0x28;
      sVar64 = (syntax_00->inputs).
               super_span<slang::syntax::UdpFieldBaseSyntax_*,_18446744073709551615UL>._M_extent.
               _M_extent_value;
      bVar33 = sVar64 == 0;
      elements_2 = pvVar76;
      if (bVar33) {
        local_2d8 = (value_type *)0x0;
        bVar58 = 1;
        elements = (value_type *)0x0;
      }
      else {
        ppUVar52 = (syntax_00->inputs).
                   super_span<slang::syntax::UdpFieldBaseSyntax_*,_18446744073709551615UL>._M_ptr;
        ppUVar1 = ppUVar52 + sVar64;
        bVar58 = 1;
        bVar33 = false;
        elements = (value_type *)0x0;
        local_2d8 = (value_type *)0x0;
        do {
          pPVar67 = (PrimitivePortSymbol *)&dir;
          pUVar6 = *ppUVar52;
          if ((pUVar6->super_SyntaxNode).kind == UdpEdgeField) {
            dir._0_1_ = 0x28;
            SmallVectorBase<char>::emplace_back<char>
                      ((SmallVectorBase<char> *)&port_1,(char *)pPVar67);
            auStack_234._4_8_ = 0;
            _dir = &stack0xfffffffffffffde0;
            local_228 = (SourceLocation)0x28;
            sVar86 = parsing::Token::rawText((Token *)&pUVar6[1].super_SyntaxNode.previewNode);
            pPVar44 = pPVar67;
            if (sVar86._M_len != 0) {
              sVar64 = 0;
              do {
                iVar38 = tolower((int)sVar86._M_str[sVar64]);
                port_2 = (PrimitivePortSymbol *)CONCAT71(port_2._1_7_,(char)iVar38);
                pPVar44 = (PrimitivePortSymbol *)&port_2;
                SmallVectorBase<char>::emplace_back<char>
                          ((SmallVectorBase<char> *)&dir,(char *)pPVar44);
                sVar64 = sVar64 + 1;
              } while (sVar86._M_len != sVar64);
            }
            sVar87 = parsing::Token::rawText((Token *)&pUVar6[2].super_SyntaxNode.parent);
            pcVar56 = sVar87._M_str;
            sVar64 = sVar87._M_len;
            if (sVar64 != 0) {
              sVar79 = 0;
              do {
                iVar38 = tolower((int)pcVar56[sVar79]);
                port_2 = (PrimitivePortSymbol *)CONCAT71(port_2._1_7_,(char)iVar38);
                pPVar44 = (PrimitivePortSymbol *)&port_2;
                pcVar46 = SmallVectorBase<char>::emplace_back<char>
                                    ((SmallVectorBase<char> *)&dir,(char *)pPVar44);
                sVar87._M_str = extraout_RDX_20;
                sVar87._M_len = (size_t)pcVar46;
                sVar79 = sVar79 + 1;
              } while (sVar64 != sVar79);
            }
            auVar12 = sVar87._1_15_;
            bVar80 = (ExpressionSyntax *)auStack_234._4_8_ == (ExpressionSyntax *)0x2;
            if (bVar80) {
              if (*(char *)_dir == '?') {
                if (*(char *)(_dir + 1) == 'x') {
                  port_2 = (PrimitivePortSymbol *)CONCAT71(port_2._1_7_,0x62);
                  SmallVectorBase<char>::emplace_back<char>
                            ((SmallVectorBase<char> *)&port_1,(char *)&port_2);
                  port_2 = (PrimitivePortSymbol *)CONCAT71(port_2._1_7_,0x78);
                  SmallVectorBase<char>::emplace_back<char>
                            ((SmallVectorBase<char> *)&port_1,(char *)&port_2);
                  goto LAB_003d866e;
                }
LAB_003d8678:
                SmallVectorBase<char>::emplace_back<char_const&>
                          ((SmallVectorBase<char> *)&port_1,(char *)_dir);
                SmallVectorBase<char>::emplace_back<char_const&>
                          ((SmallVectorBase<char> *)&port_1,(char *)(_dir + 1));
                bVar58 = (*(char *)(_dir + 1) == 'x' && *(char *)_dir == 'x') & bVar58;
              }
              else {
                if ((*(char *)_dir != 'x') || (*(char *)(_dir + 1) != '?')) goto LAB_003d8678;
                port_2 = (PrimitivePortSymbol *)CONCAT71(port_2._1_7_,0x78);
                SmallVectorBase<char>::emplace_back<char>
                          ((SmallVectorBase<char> *)&port_1,(char *)&port_2);
                port_2 = (PrimitivePortSymbol *)CONCAT71(port_2._1_7_,0x62);
                SmallVectorBase<char>::emplace_back<char>
                          ((SmallVectorBase<char> *)&port_1,(char *)&port_2);
LAB_003d866e:
                bVar58 = 0;
              }
              port_2 = (PrimitivePortSymbol *)CONCAT71(port_2._1_7_,0x29);
              pPVar44 = (PrimitivePortSymbol *)&port_2;
              pcVar46 = SmallVectorBase<char>::emplace_back<char>
                                  ((SmallVectorBase<char> *)&port_1,(char *)pPVar44);
              auVar9._8_8_ = extraout_RDX_22;
              auVar9._0_8_ = pcVar46;
              auVar12 = auVar9._1_15_;
              elements = (value_type *)((long)&(elements->first)._M_len + 1);
            }
            if ((undefined1 *)_dir != &stack0xfffffffffffffde0) {
              operator_delete((void *)_dir);
              auVar11._8_8_ = extraout_RDX_23;
              auVar11._0_8_ = extraout_RAX;
              auVar12 = auVar11._1_15_;
            }
            local_2d8 = (value_type *)CONCAT71(auVar12._0_7_,1);
            auVar10._8_8_ = auVar12._7_8_;
            auVar10._0_8_ = local_2d8;
            auVar12 = auVar10._1_15_;
          }
          else {
            _dir = *(undefined1 (*) [16])(pUVar6 + 1);
            sVar86 = parsing::Token::rawText((Token *)pPVar67);
            pcVar56 = sVar86._M_str;
            sVar64 = sVar86._M_len;
            if (sVar64 != 0) {
              elements = (value_type *)((long)&(elements->first)._M_len + sVar64);
              sVar79 = 0;
              do {
                uVar40 = tolower((int)pcVar56[sVar79]);
                port_2 = (PrimitivePortSymbol *)CONCAT71(port_2._1_7_,(char)uVar40);
                uVar49 = (uVar40 & 0xff) - 0x66;
                if (((uVar49 < 0xd) && ((0x1501U >> (uVar49 & 0x1f) & 1) != 0)) ||
                   ((uVar40 & 0xff) == 0x2a)) {
                  local_2d8 = (value_type *)0x1;
                }
                pPVar44 = (PrimitivePortSymbol *)&port_2;
                pcVar46 = SmallVectorBase<char>::emplace_back<char_const&>
                                    ((SmallVectorBase<char> *)&port_1,(char *)pPVar44);
                sVar86._M_len._1_7_ = (int7)((ulong)pcVar46 >> 8);
                sVar86._M_len._0_1_ = (char)port_2 == 'x';
                sVar86._M_str = extraout_RDX_21;
                bVar58 = bVar58 & (char)port_2 == 'x';
                sVar79 = sVar79 + 1;
              } while (sVar64 != sVar79);
            }
            auVar12 = sVar86._1_15_;
            bVar80 = true;
          }
          pEVar57 = auVar12._7_8_;
          if (!bVar80) break;
          ppUVar52 = ppUVar52 + 1;
          bVar33 = ppUVar52 == ppUVar1;
        } while (!bVar33);
      }
      pPVar67 = (PrimitivePortSymbol *)&dir;
      sVar88._M_str = (char *)pEVar57;
      sVar88._M_len = (size_t)local_2d8;
      if (bVar33) {
        if ((sVar55 < 2) || (pvVar76 = (value_type *)(sVar55 - 1), elements == pvVar76)) {
          pUVar6 = syntax_00->current;
          if (pUVar6 == (UdpFieldBaseSyntax *)0x0) {
            pPVar44 = (PrimitivePortSymbol *)0x0;
          }
          else {
            if ((pUVar6->super_SyntaxNode).kind == UdpSimpleField) {
              sVar88 = parsing::Token::rawText((Token *)(pUVar6 + 1));
              bVar33 = true;
              if (sVar88._M_len == 1) {
                uVar40 = tolower((int)*sVar88._M_str);
                pPVar44 = (PrimitivePortSymbol *)(ulong)uVar40;
                uVar49 = (uVar40 & 0xff) - 0x3f;
                uVar77 = extraout_RDX_24;
                if (((uVar49 < 0x3a) &&
                    (uVar77 = 0x200000800000001,
                    (0x200000800000001U >> ((ulong)uVar49 & 0x3f) & 1) != 0)) ||
                   (auVar25._8_8_ = 0, auVar25._0_8_ = uVar77,
                   sVar88 = (string_view)(auVar25 << 0x40), (uVar40 & 0xff) - 0x30 < 2)) {
                  auVar26._8_8_ = 0;
                  auVar26._0_8_ = uVar77;
                  sVar88 = (string_view)(auVar26 << 0x40);
                  bVar33 = false;
                }
              }
              if (bVar33) goto LAB_003d8805;
            }
            else {
LAB_003d8805:
              pPVar44 = (PrimitivePortSymbol *)0x0;
            }
            pEVar57 = (EVP_PKEY_CTX *)sVar88._M_str;
            if ((char)pPVar44 == '\0') goto LAB_003d8b9f;
          }
          pUVar6 = syntax_00->next;
          if ((pUVar6 == (UdpFieldBaseSyntax *)0x0) ||
             ((pUVar6->super_SyntaxNode).kind != UdpSimpleField)) {
LAB_003d8869:
            auVar18._8_8_ = 0;
            auVar18._0_8_ = sVar88._M_str;
            sVar88 = (string_view)(auVar18 << 0x40);
          }
          else {
            pPVar44 = (PrimitivePortSymbol *)((ulong)pPVar44 & 0xffffffff);
            sVar88 = parsing::Token::rawText((Token *)(pUVar6 + 1));
            bVar33 = true;
            if (sVar88._M_len == 1) {
              uVar40 = tolower((int)*sVar88._M_str);
              bVar36 = (byte)uVar40;
              sVar13._M_str._0_1_ = bVar36;
              sVar13._M_len = (ulong)uVar40;
              sVar13._M_str._1_7_ = 0;
              sVar88._M_str._0_1_ = bVar36;
              sVar88._M_len = (ulong)uVar40;
              sVar88._M_str._1_7_ = 0;
              if (((bVar36 < 0x32) && ((0x3200000000000U >> ((ulong)bVar36 & 0x3f) & 1) != 0)) ||
                 ((uVar40 & 0xff) == 0x78)) {
                bVar33 = false;
              }
              else {
                bVar33 = true;
                sVar88 = sVar13;
              }
            }
            if (bVar33) goto LAB_003d8869;
          }
          pEVar57 = (EVP_PKEY_CTX *)sVar88._M_str;
          bVar36 = (byte)sVar88._M_len;
          if (bVar36 != 0) {
            auStack_234._4_8_ = 0;
            _dir = &stack0xfffffffffffffde0;
            local_228 = (SourceLocation)0x5;
            inputs._M_ptr._6_2_ = port_1._6_2_;
            inputs._M_ptr._0_6_ = port_1._0_6_;
            inputs._M_extent._M_extent_value._0_4_ = SStack_290;
            inputs._M_extent._M_extent_value._4_1_ = bStack_28c;
            inputs._M_extent._M_extent_value._5_1_ = bStack_28b;
            inputs._M_extent._M_extent_value._6_2_ = uStack_28a;
            stateChar = (byte)pPVar44;
            BitTrie::insert<slang::PoolAllocator<slang::ast::BitTrie,72ul,8ul>>
                      ((BitTrie *)&name,syntax_00,inputs,stateChar,&trieAlloc,
                       (SmallVector<const_slang::syntax::UdpEntrySyntax_*,_5UL> *)pPVar67);
            pEVar57 = extraout_RDX_26;
            if ((ExpressionSyntax *)auStack_234._4_8_ == (ExpressionSyntax *)0x0) {
              if ((bool)(~bVar58 & 1) || bVar36 == 0x78) goto LAB_003d8aed;
              SVar85 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax_00);
              pPVar44 = (PrimitivePortSymbol *)0xca0006;
              Scope::addDiag(scope,(DiagCode)0xca0006,SVar85);
              pEVar57 = extraout_RDX_28;
            }
            else {
              uVar73 = _dir;
              bVar33 = (bVar36 & 0xfe) == 0x30;
              lVar70 = auStack_234._4_8_ << 3;
              lVar74 = 0;
              pUVar61 = syntax_00;
              do {
                sVar16._M_str = (char *)pEVar57;
                sVar16._M_len = uVar73;
                sVar89._M_str = (char *)pEVar57;
                sVar89._M_len = uVar73;
                pSVar60 = *(SyntaxNode **)(uVar73 + lVar74);
                piVar7 = *(int **)(pSVar60 + 5);
                if ((piVar7 == (int *)0x0) || (sVar89 = sVar16, *piVar7 != 0x1e5)) {
LAB_003d8984:
                  pUVar61 = (UdpEntrySyntax *)0x0;
                }
                else {
                  sVar89 = parsing::Token::rawText((Token *)(piVar7 + 6));
                  bVar80 = true;
                  if (sVar89._M_len == 1) {
                    uVar40 = tolower((int)*sVar89._M_str);
                    pUVar61 = (UdpEntrySyntax *)(ulong)uVar40;
                    uVar77 = (ulong)pUVar61 & 0xff;
                    sVar15._M_str = extraout_RDX_27;
                    sVar15._M_len = uVar77;
                    sVar14._M_str = extraout_RDX_27;
                    sVar14._M_len = uVar77;
                    sVar89._M_str = extraout_RDX_27;
                    sVar89._M_len = uVar77;
                    if (((byte)uVar40 < 0x32) &&
                       ((0x3200000000000U >> ((ulong)pUVar61 & 0x3f) & 1) != 0)) {
                      bVar80 = false;
                    }
                    else {
                      sVar89 = sVar14;
                      if ((int)uVar77 == 0x78) {
                        bVar80 = false;
                        sVar89 = sVar15;
                      }
                    }
                  }
                  if (bVar80) goto LAB_003d8984;
                }
                piVar7 = *(int **)(pSVar60 + 4);
                if ((piVar7 == (int *)0x0) || (*piVar7 != 0x1e5)) {
LAB_003d89ea:
                  auVar19._8_8_ = 0;
                  auVar19._0_8_ = sVar89._M_str;
                  sVar89 = (string_view)(auVar19 << 0x40);
                }
                else {
                  sVar89 = parsing::Token::rawText((Token *)(piVar7 + 6));
                  bVar80 = true;
                  if (sVar89._M_len == 1) {
                    uVar40 = tolower((int)*sVar89._M_str);
                    uVar49 = (uVar40 & 0xff) - 0x3f;
                    sVar17._M_str._0_4_ = uVar49;
                    sVar17._M_len = (ulong)uVar40;
                    sVar17._M_str._4_4_ = 0;
                    sVar89._M_str._0_4_ = uVar49;
                    sVar89._M_len = (ulong)uVar40;
                    sVar89._M_str._4_4_ = 0;
                    if (((uVar49 < 0x3a) &&
                        ((0x200000800000001U >> ((ulong)uVar49 & 0x3f) & 1) != 0)) ||
                       ((uVar40 & 0xff) - 0x30 < 2)) {
                      bVar80 = false;
                      sVar89 = sVar17;
                    }
                  }
                  if (bVar80) goto LAB_003d89ea;
                }
                pEVar57 = (EVP_PKEY_CTX *)sVar89._M_str;
                bVar58 = (byte)pUVar61;
                if (bVar58 != bVar36) {
                  if (bVar58 == 0x2d) {
                    bVar37 = (byte)sVar89._M_len;
                    if (bVar37 < 0x62) {
                      uVar40 = bVar37 - 0x30;
                      pEVar57 = (EVP_PKEY_CTX *)(ulong)uVar40;
                      if (uVar40 < 2) {
LAB_003d8a23:
                        pEVar57 = (EVP_PKEY_CTX *)
                                  CONCAT71((int7)((ulong)pEVar57 >> 8),bVar36 == bVar37);
                      }
                      else {
                        if (bVar37 != 0x3f) goto LAB_003d8a2d;
                        pEVar57 = (EVP_PKEY_CTX *)
                                  (ulong)CONCAT31((int3)(uVar40 >> 8),bVar36 == 0x78 || bVar33);
                      }
                    }
                    else {
                      pEVar57 = (EVP_PKEY_CTX *)CONCAT71(sVar89._M_str._1_7_,bVar33);
                      if (bVar37 != 0x62) {
                        if (bVar37 == 0x78) goto LAB_003d8a23;
                        goto LAB_003d8a2d;
                      }
                    }
                    if ((char)pEVar57 != '\0') goto LAB_003d8a8a;
                  }
LAB_003d8a2d:
                  if (bVar36 == 0x2d) {
                    uVar40 = (uint)pPVar44 & 0xff;
                    if (stateChar < 0x62) {
                      if (((uint)pPVar44 & 0xff) - 0x30 < 2) {
LAB_003d8a73:
                        bVar80 = bVar58 == stateChar;
                      }
                      else {
                        if (uVar40 != 0x3f) goto LAB_003d8b48;
                        bVar80 = bVar58 == 0x78 || (bVar58 & 0xfe) == 0x30;
                      }
                    }
                    else {
                      if (stateChar != 0x62) {
                        if (uVar40 == 0x78) goto LAB_003d8a73;
                        goto LAB_003d8b48;
                      }
                      pUVar61 = (UdpEntrySyntax *)(ulong)(bVar58 & 0xfe);
                      bVar80 = (bVar58 & 0xfe) == 0x30;
                    }
                    if (bVar80) goto LAB_003d8a8a;
                  }
LAB_003d8b48:
                  SVar85 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax_00);
                  pDVar45 = Scope::addDiag(scope,(DiagCode)0xcb0006,SVar85);
                  SVar85 = slang::syntax::SyntaxNode::sourceRange(pSVar60);
                  pPVar44 = (PrimitivePortSymbol *)0xa0001;
                  Diagnostic::addNote(pDVar45,(DiagCode)0xa0001,SVar85);
                  pEVar57 = extraout_RDX_31;
                  goto LAB_003d8b8d;
                }
LAB_003d8a8a:
                lVar74 = lVar74 + 8;
              } while (lVar70 != lVar74);
LAB_003d8aed:
              iVar38 = SmallVectorBase<char>::copy
                                 ((SmallVectorBase<char> *)&port_1,
                                  (EVP_PKEY_CTX *)scope->compilation,pEVar57);
              local_2b8 = CONCAT44(extraout_var_01,iVar38);
              local_2b0._M_local_buf[2] = (char)local_2d8;
              pPVar44 = (PrimitivePortSymbol *)&port_2;
              port_2 = extraout_RDX_29;
              local_2b0._M_local_buf[0] = stateChar;
              local_2b0._M_local_buf[1] = bVar36;
              SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry>::
              emplace_back<slang::ast::PrimitiveSymbol::TableEntry>
                        ((SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry> *)&port,
                         (TableEntry *)pPVar44);
              pEVar57 = extraout_RDX_30;
            }
LAB_003d8b8d:
            if ((undefined1 *)_dir != &stack0xfffffffffffffde0) {
              operator_delete((void *)_dir);
              pEVar57 = extraout_RDX_32;
            }
          }
        }
        else {
          SVar85 = slang::syntax::SyntaxNode::sourceRange
                             (&(syntax_00->inputs).super_SyntaxListBase.super_SyntaxNode);
          pDVar45 = Scope::addDiag(scope,(DiagCode)0xcc0006,SVar85);
          _dir = elements;
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::emplace_back<unsigned_long>(&pDVar45->args,(unsigned_long *)pPVar67);
          _dir = pvVar76;
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::emplace_back<unsigned_long>(&pDVar45->args,(unsigned_long *)pPVar67);
          pEVar57 = extraout_RDX_25;
          pPVar44 = pPVar67;
        }
      }
LAB_003d8b9f:
      if ((char *)CONCAT26(port_1._6_2_,port_1._0_6_) != local_288[0]._M_local_buf + 8) {
        operator_delete((char *)CONCAT26(port_1._6_2_,port_1._0_6_));
        pEVar57 = extraout_RDX_33;
      }
      if (((Info *)_uStack_1f0 != (Info *)0x0) &&
         (*(char *)((long)&(this_00->super_ValueSymbol).driverMap.field_0 + 0x21) == '\0')) {
        *(undefined1 *)((long)&(this_00->super_ValueSymbol).driverMap.field_0 + 0x21) =
             *(undefined1 *)((long)port + _uStack_1f0 * 0x18 + -6);
      }
      pvVar76 = (value_type *)&(elements_2->first)._M_str;
    } while (pvVar76 != elements_1);
  }
  iVar38 = SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry>::copy
                     ((SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry> *)&port,
                      (EVP_PKEY_CTX *)local_248.typeSyntax,pEVar57);
  (this_00->super_ValueSymbol).driverMap.field_0.rootLeaf.
  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
  .first[0].right = CONCAT44(extraout_var_02,iVar38);
  (this_00->super_ValueSymbol).driverMap.field_0.rootLeaf.
  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
  .first[1].left = extraout_RDX_34;
  if ((extraout_RDX_34 != 0 &
      *(byte *)((long)&(this_00->super_ValueSymbol).driverMap.field_0 + 0x21)) == 1) {
    sVar64 = (this_00->super_ValueSymbol).driverMap.field_0.rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
             .first[0].left;
    port_1._0_6_ = SUB86(local_288,0);
    port_1._6_2_ = (undefined2)((ulong)local_288 >> 0x30);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&port_1,AllPrimEdges[1],*AllPrimEdges + AllPrimEdges[1]);
    __n2 = sVar64 - 2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_1,
               CONCAT26(uStack_28a,CONCAT15(bStack_28b,CONCAT14(bStack_28c,SStack_290))),0,__n2,'0')
    ;
    _dir = &stack0xfffffffffffffdd8;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dir,__n2,'x');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dir,"(x1)",4);
    port_2 = (PrimitivePortSymbol *)&local_2b0;
    local_2b8 = 0;
    local_2b0._M_local_buf[0] = 0;
    local_248 = (anon_union_8_2_f12d5f64_for_typeOrLink)scope->compilation;
    elements_3 = (value_type *)0x0;
    uVar40 = 0;
LAB_003d8d2e:
    inputs_00._M_ptr._6_2_ = port_1._6_2_;
    inputs_00._M_ptr._0_6_ = port_1._0_6_;
    inputs_00._M_extent._M_extent_value._0_4_ = SStack_290;
    inputs_00._M_extent._M_extent_value._4_1_ = bStack_28c;
    inputs_00._M_extent._M_extent_value._5_1_ = bStack_28b;
    inputs_00._M_extent._M_extent_value._6_2_ = uStack_28a;
    bVar33 = BitTrie::contains((BitTrie *)&name,inputs_00,'?');
    if (bVar33) {
LAB_003d8e06:
      __n_00 = (ExpressionSyntax *)
               CONCAT26(uStack_28a,CONCAT15(bStack_28b,CONCAT14(bStack_28c,SStack_290)));
      if ((*(char *)((long)CONCAT26(port_1._6_2_,port_1._0_6_) + -1 + (long)__n_00) == ')') &&
         (__n_00 == (ExpressionSyntax *)auStack_234._4_8_)) {
        if (__n_00 == (ExpressionSyntax *)0x0) goto LAB_003d8f7d;
        iVar38 = bcmp((void *)CONCAT26(port_1._6_2_,port_1._0_6_),(void *)_dir,(size_t)__n_00);
        if (iVar38 == 0) goto LAB_003d8f7d;
      }
      if (__n_00 != (ExpressionSyntax *)0x0) {
        pbVar65 = (byte *)0x0;
        do {
          __s = (void *)CONCAT26(port_1._6_2_,port_1._0_6_);
          pVVar66 = (ValueDriver *)((long)__s + (long)pbVar65);
          cVar68 = *(char *)((long)__s + (long)pbVar65);
          if (cVar68 == '(') {
            local_178._0_8_ = (ValueDriver *)0x4;
            local_178._8_8_ = pVVar66;
            if ((*(long *)(DAT_005d4910 + -0x10) == 4) &&
               (*(int *)&(pVVar66->prefixExpression).ptr == **(int **)(DAT_005d4910 + -8))) {
              if (*(char *)((long)__s + -1 + (long)__n_00) == 'x') {
                if (0 < (long)__n_00) {
                  memset(__s,0x30,(size_t)__n_00);
                }
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_1
                        ,(size_type)(pbVar65 + 1),4,(char *)AllPrimEdges[1],*AllPrimEdges);
                goto LAB_003d8ed8;
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_1,
                      (size_type)pbVar65,4,(char *)AllPrimEdges[1],*AllPrimEdges);
              pbVar65 = pbVar65 + 3;
              bVar33 = true;
            }
            else {
              _Var47 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::basic_string_view<char,std::char_traits<char>>const>>
                                 (AllPrimEdges,DAT_005d4910,local_178);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_1,
                      (size_type)pbVar65,4,_Var47._M_current[1]._M_str,_Var47._M_current[1]._M_len);
LAB_003d8ed8:
              bVar33 = false;
            }
            if (!bVar33) break;
          }
          else {
            if (cVar68 == '0') {
              cVar68 = '1';
LAB_003d8f65:
              *(char *)&(pVVar66->prefixExpression).ptr = cVar68;
              break;
            }
            if (cVar68 == '1') {
              cVar68 = 'x';
              goto LAB_003d8f65;
            }
            *(char *)&(pVVar66->prefixExpression).ptr = '0';
          }
          pbVar65 = pbVar65 + 1;
          __n_00 = (ExpressionSyntax *)
                   CONCAT26(uStack_28a,CONCAT15(bStack_28b,CONCAT14(bStack_28c,SStack_290)));
        } while (pbVar65 < __n_00);
      }
      goto LAB_003d8d2e;
    }
    if (elements_3 == (value_type *)0x0) {
      elements_3 = (value_type *)
                   Scope::addDiag(scope,(DiagCode)0xfa0006,
                                  (this_00->super_ValueSymbol).super_Symbol.location);
    }
    if (uVar40 < ((local_248.link)->flags).m_bits) {
      lVar70 = CONCAT26(uStack_28a,CONCAT15(bStack_28b,CONCAT14(bStack_28c,SStack_290)));
      if (lVar70 != 0) {
        lVar74 = CONCAT26(port_1._6_2_,port_1._0_6_);
        bVar33 = true;
        lVar62 = 0;
        do {
          cVar68 = *(char *)(lVar74 + lVar62);
          if (cVar68 == '(') {
            bVar33 = false;
          }
          else if (cVar68 == ')') {
            bVar33 = true;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_2,
                     cVar68);
          if (bVar33) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_2,
                      ' ');
          }
          lVar62 = lVar62 + 1;
        } while (lVar70 != lVar62);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_2,'\n');
      uVar40 = uVar40 + 1;
      goto LAB_003d8e06;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_2,
               "...and more\n");
LAB_003d8f7d:
    if ((elements_3 != (value_type *)0x0) && (local_2b8 != 0)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_2);
      pDVar45 = Diagnostic::addNote((Diagnostic *)elements_3,(DiagCode)0xe70006,
                                    (SourceLocation)0xffffffffffffffff);
      Diagnostic::operator<<(pDVar45,(string *)&port_2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)port_2 != &local_2b0) {
      operator_delete(port_2,CONCAT53(local_2b0._M_allocated_capacity._3_5_,
                                      CONCAT12(local_2b0._M_local_buf[2],
                                               CONCAT11(local_2b0._M_local_buf[1],
                                                        local_2b0._M_local_buf[0]))) + 1);
    }
    if ((undefined8 *)_dir != &stack0xfffffffffffffdd8) {
      operator_delete((void *)_dir,local_228 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT26(port_1._6_2_,port_1._0_6_) != local_288) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT26(port_1._6_2_,port_1._0_6_),
                      (size_t)(local_288[0]._M_allocated_capacity + 1));
    }
  }
  if (port != (PrimitivePortSymbol *)&stack0xfffffffffffffe20) {
    operator_delete(port);
  }
  BumpAllocator::~BumpAllocator(&alloc);
LAB_003d9053:
  if (ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_ !=
      (pointer)ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.firstElement) {
    operator_delete(ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_);
  }
  return (PrimitiveSymbol *)this_00;
}

Assistant:

PrimitiveSymbol& PrimitiveSymbol::fromSyntax(const Scope& scope,
                                             const UdpDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto primName = syntax.name.valueText();
    auto prim = comp.emplace<PrimitiveSymbol>(comp, primName, syntax.name.location(),
                                              PrimitiveSymbol::UserDefined);
    prim->setAttributes(scope, syntax.attributes);
    prim->setSyntax(syntax);

    auto portList = syntax.portList.get();
    if (portList->kind == SyntaxKind::WildcardUdpPortList) {
        auto externPrim = comp.getExternDefinition(primName, scope);
        if (!externPrim || externPrim->kind != SyntaxKind::ExternUdpDecl)
            scope.addDiag(diag::MissingExternWildcardPorts, portList->sourceRange()) << primName;
        else
            portList = externPrim->as<ExternUdpDeclSyntax>().portList;
    }

    SmallVector<const PrimitivePortSymbol*> ports;
    if (portList->kind == SyntaxKind::AnsiUdpPortList) {
        for (auto decl : portList->as<AnsiUdpPortListSyntax>().ports) {
            if (decl->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outputDecl = decl->as<UdpOutputPortDeclSyntax>();
                PrimitivePortDirection dir = PrimitivePortDirection::Out;
                if (outputDecl.reg)
                    dir = PrimitivePortDirection::OutReg;

                auto port = comp.emplace<PrimitivePortSymbol>(comp, outputDecl.name.valueText(),
                                                              outputDecl.name.location(), dir);
                port->setSyntax(*decl);
                port->setAttributes(scope, decl->attributes);
                ports.push_back(port);
                prim->addMember(*port);
            }
            else {
                auto& inputDecl = decl->as<UdpInputPortDeclSyntax>();
                for (auto nameSyntax : inputDecl.names) {
                    auto name = nameSyntax->identifier;
                    auto port = comp.emplace<PrimitivePortSymbol>(comp, name.valueText(),
                                                                  name.location(),
                                                                  PrimitivePortDirection::In);

                    port->setSyntax(*nameSyntax);
                    port->setAttributes(scope, decl->attributes);
                    ports.push_back(port);
                    prim->addMember(*port);
                }
            }
        }

        if (!syntax.body->portDecls.empty())
            scope.addDiag(diag::PrimitiveAnsiMix, syntax.body->portDecls[0]->sourceRange());
    }
    else if (portList->kind == SyntaxKind::NonAnsiUdpPortList) {
        // In the non-ansi case the port list only gives the ordering, we need to
        // look through the body decls to get the rest of the port info.
        SmallMap<std::string_view, PrimitivePortSymbol*, 4> portMap;
        for (auto nameSyntax : portList->as<NonAnsiUdpPortListSyntax>().ports) {
            auto name = nameSyntax->identifier;
            auto port = comp.emplace<PrimitivePortSymbol>(comp, name.valueText(), name.location(),
                                                          PrimitivePortDirection::In);
            ports.push_back(port);
            prim->addMember(*port);
            if (!name.valueText().empty())
                portMap.emplace(name.valueText(), port);
        }

        auto checkDup = [&](auto port, auto nameToken) {
            // If this port already has a syntax node set it's a duplicate declaration.
            if (auto prevSyntax = port->getSyntax()) {
                auto& diag = scope.addDiag(diag::PrimitivePortDup, nameToken.range());
                diag << nameToken.valueText();
                diag.addNote(diag::NotePreviousDefinition, port->location);
            }
        };

        const UdpOutputPortDeclSyntax* regSpecifier = nullptr;
        for (auto decl : syntax.body->portDecls) {
            if (decl->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outputDecl = decl->as<UdpOutputPortDeclSyntax>();
                auto name = outputDecl.name;
                if (auto it = portMap.find(name.valueText()); it != portMap.end()) {
                    // Standalone "reg" specifiers should be saved and processed at the
                    // end once we've handled all of the regular declarations.
                    if (outputDecl.reg && !outputDecl.keyword) {
                        if (regSpecifier) {
                            auto& diag = scope.addDiag(diag::PrimitiveRegDup,
                                                       outputDecl.reg.range());
                            diag.addNote(diag::NotePreviousDefinition,
                                         regSpecifier->reg.location());
                        }
                        regSpecifier = &outputDecl;
                        continue;
                    }

                    auto port = it->second;
                    checkDup(port, name);

                    port->direction = PrimitivePortDirection::Out;
                    if (outputDecl.reg)
                        port->direction = PrimitivePortDirection::OutReg;

                    port->location = name.location();
                    port->setSyntax(outputDecl);
                    port->setAttributes(scope, decl->attributes);
                }
                else if (!name.valueText().empty()) {
                    auto& diag = scope.addDiag(diag::PrimitivePortUnknown, name.range());
                    diag << name.valueText();
                }
            }
            else {
                auto& inputDecl = decl->as<UdpInputPortDeclSyntax>();
                for (auto nameSyntax : inputDecl.names) {
                    auto name = nameSyntax->identifier;
                    if (auto it = portMap.find(name.valueText()); it != portMap.end()) {
                        auto port = it->second;
                        checkDup(port, name);

                        // Direction is already set to In here, so just update
                        // our syntax, location, etc.
                        port->location = name.location();
                        port->setSyntax(*nameSyntax);
                        port->setAttributes(scope, decl->attributes);
                    }
                    else if (!name.valueText().empty()) {
                        auto& diag = scope.addDiag(diag::PrimitivePortUnknown, name.range());
                        diag << name.valueText();
                    }
                }
            }
        }

        if (regSpecifier) {
            auto name = regSpecifier->name;
            auto it = portMap.find(name.valueText());
            SLANG_ASSERT(it != portMap.end());

            auto port = it->second;
            if (port->getSyntax()) {
                if (port->direction == PrimitivePortDirection::OutReg) {
                    checkDup(port, name);
                }
                else if (port->direction == PrimitivePortDirection::In) {
                    auto& diag = scope.addDiag(diag::PrimitiveRegInput, name.range());
                    diag << port->name;
                }
                else {
                    port->direction = PrimitivePortDirection::OutReg;
                }
            }
        }

        for (auto port : ports) {
            if (!port->getSyntax() && !port->name.empty()) {
                auto& diag = scope.addDiag(diag::PrimitivePortMissing, port->location);
                diag << port->name;
            }
        }
    }
    else {
        // This is an error condition (wildcard port list without a
        // corresponding extern decl). The error has already been
        // issued so just get out of here.
        return *prim;
    }

    prim->ports = ports.copy(comp);
    if (ports.size() < 2)
        scope.addDiag(diag::PrimitiveTwoPorts, prim->location);
    else if (ports[0]->direction == PrimitivePortDirection::In)
        scope.addDiag(diag::PrimitiveOutputFirst, ports[0]->location);
    else {
        const ExpressionSyntax* initExpr = nullptr;
        if (ports[0]->direction == PrimitivePortDirection::OutReg) {
            prim->isSequential = true;

            // If the first port is an 'output reg' check if it specifies
            // the initial value inline.
            auto portSyntax = ports[0]->getSyntax();
            if (portSyntax && portSyntax->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outSyntax = portSyntax->as<UdpOutputPortDeclSyntax>();
                if (outSyntax.initializer)
                    initExpr = outSyntax.initializer->expr;
            }
        }

        // Make sure we have only one output port.
        for (size_t i = 1; i < ports.size(); i++) {
            if (ports[i]->direction != PrimitivePortDirection::In) {
                scope.addDiag(diag::PrimitiveDupOutput, ports[i]->location);
                break;
            }
        }

        // If we have an initial statement check it for correctness.
        if (auto initial = syntax.body->initialStmt) {
            if (!prim->isSequential)
                scope.addDiag(diag::PrimitiveInitialInComb, initial->sourceRange());
            else if (initExpr) {
                auto& diag = scope.addDiag(diag::PrimitiveDupInitial, initial->sourceRange());
                diag.addNote(diag::NotePreviousDefinition, initExpr->getFirstToken().location());
            }
            else {
                initExpr = initial->value;

                auto initialName = initial->name.valueText();
                if (!initialName.empty() && !ports[0]->name.empty() &&
                    initialName != ports[0]->name) {
                    auto& diag = scope.addDiag(diag::PrimitiveWrongInitial, initial->name.range());
                    diag << initialName;
                    diag.addNote(diag::NoteDeclarationHere, ports[0]->location);
                }
            }
        }

        if (initExpr) {
            ASTContext context(scope, LookupLocation::max);
            auto& expr = Expression::bind(*initExpr, context);
            if (!expr.bad()) {
                if (expr.kind == ExpressionKind::IntegerLiteral &&
                    (expr.type->getBitWidth() == 1 || expr.isUnsizedInteger())) {
                    context.eval(expr);
                    if (expr.constant) {
                        auto& val = expr.constant->integer();
                        if (val == 0 || val == 1 ||
                            (val.getBitWidth() == 1 && exactlyEqual(val[0], logic_t::x))) {
                            prim->initVal = expr.constant;
                        }
                    }
                }

                if (!prim->initVal)
                    scope.addDiag(diag::PrimitiveInitVal, expr.sourceRange);
            }
        }

        BitTrie trie;
        BumpAllocator alloc;
        PoolAllocator<BitTrie> trieAlloc(alloc);
        SmallVector<TableEntry> table;
        for (auto entry : syntax.body->entries) {
            createTableRow(scope, *entry, table, ports.size(), trie, trieAlloc);
            if (!table.empty() && !prim->isEdgeSensitive)
                prim->isEdgeSensitive = table.back().isEdgeSensitive;
        }

        prim->table = table.copy(comp);
        checkPrimitiveEdgeCombinations(*prim, scope, trie);
    }

    return *prim;
}